

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O3

void __thiscall
LastVal<BoolView,_bool>::LastVal(LastVal<BoolView,_bool> *this,BoolView *_x,bool *_v)

{
  LastVal<BoolView,_bool> *local_28;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_28 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_28);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020eec0;
  this->x = _x;
  this->v = _v;
  (this->super_Propagator).priority = 0;
  BoolView::attach(_x,&this->super_Propagator,0,8);
  return;
}

Assistant:

LastVal(Var* _x, Val* _v) : x(_x), v(_v) {
		priority = 0;
		x->attach(this, 0, EVENT_F);
	}